

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_test.c
# Opt level: O2

void test_ipc_listener_clean_stale(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char local_128 [8];
  char renamed [256];
  nng_stream_listener *l;
  nng_socket s0;
  
  nuts_scratch_addr("ipc",0x40,test_ipc_listener_clean_stale::nuts_addr_);
  nVar1 = nng_pair1_open((nng_socket *)((long)&l + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0x17d,"%s: expected success, got %s (%d)","nng_pair1_open(&(s0))",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_stream_listener_alloc
                      ((nng_stream_listener **)(renamed + 0xf8),
                       test_ipc_listener_clean_stale::nuts_addr_);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                           ,0x180,"%s: expected success, got %s (%d)",
                           "nng_stream_listener_alloc(&l, addr)",pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_stream_listener_listen((nng_stream_listener *)renamed._248_8_);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                             ,0x181,"%s: expected success, got %s (%d)",
                             "nng_stream_listener_listen(l)",pcVar3,nVar1);
      if (iVar2 != 0) {
        snprintf(local_128,0x100,"%s.renamed",test_ipc_listener_clean_stale::nuts_addr_ + 6);
        iVar2 = rename(test_ipc_listener_clean_stale::nuts_addr_ + 6,local_128);
        iVar2 = acutest_check_((uint)(iVar2 == 0),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                               ,0x184,"%s","rename(path, renamed) == 0");
        if (iVar2 != 0) {
          nng_stream_listener_close((nng_stream_listener *)renamed._248_8_);
          nng_stream_listener_free((nng_stream_listener *)renamed._248_8_);
          nng_msleep(100);
          iVar2 = rename(local_128,test_ipc_listener_clean_stale::nuts_addr_ + 6);
          iVar2 = acutest_check_((uint)(iVar2 == 0),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                 ,0x189,"%s","rename(renamed, path) == 0");
          if (iVar2 != 0) {
            nVar1 = nng_listen(l._4_4_,test_ipc_listener_clean_stale::nuts_addr_,(nng_listener *)0x0
                               ,0);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                   ,0x18b,"%s: expected success, got %s (%d)",
                                   "nng_listen(s0, addr, NULL, 0)",pcVar3,nVar1);
            if (iVar2 != 0) {
              nng_msleep(0x32);
              nVar1 = nng_socket_close(l._4_4_);
              pcVar3 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                     ,0x18d,"%s: expected success, got %s (%d)",
                                     "nng_socket_close(s0)",pcVar3,nVar1);
              if (iVar2 != 0) {
                return;
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_ipc_listener_clean_stale(void)
{
#ifdef NNG_PLATFORM_POSIX
	nng_socket           s0;
	nng_stream_listener *l;
	char                *addr;
	char                *path;
	char                 renamed[256];

	NUTS_ADDR(addr, "ipc");
	NUTS_OPEN(s0);

	// start a listening stream listener but do not call accept
	NUTS_PASS(nng_stream_listener_alloc(&l, addr));
	NUTS_PASS(nng_stream_listener_listen(l));
	path = addr + strlen("ipc://");
	snprintf(renamed, sizeof(renamed), "%s.renamed", path);
	NUTS_ASSERT(rename(path, renamed) == 0);
	nng_stream_listener_close(l);
	nng_stream_listener_free(l);
	nng_msleep(100);
	// put it back
	NUTS_ASSERT(rename(renamed, path) == 0);

	NUTS_PASS(nng_listen(s0, addr, NULL, 0));
	nng_msleep(50);
	NUTS_CLOSE(s0);
#else
	NUTS_SKIP("Not POSIX.");
#endif
}